

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

uECC_word_t
uECC_vli_add(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  ulong uVar1;
  uECC_word_t uVar2;
  int iVar3;
  undefined7 in_register_00000009;
  long lVar4;
  ulong uVar5;
  
  lVar4 = 0;
  iVar3 = (int)CONCAT71(in_register_00000009,num_words);
  if (num_words < '\x01') {
    iVar3 = 0;
  }
  uVar2 = 0;
  for (; iVar3 != lVar4; lVar4 = lVar4 + 1) {
    uVar1 = left[lVar4];
    uVar5 = uVar1 + uVar2 + right[lVar4];
    if (uVar5 != uVar1) {
      uVar2 = (ulong)(uVar5 < uVar1);
    }
    result[lVar4] = uVar5;
  }
  return uVar2;
}

Assistant:

uECC_VLI_API uECC_word_t uECC_vli_add(uECC_word_t *result,
                                      const uECC_word_t *left,
                                      const uECC_word_t *right,
                                      wordcount_t num_words) {
    uECC_word_t carry = 0;
    wordcount_t i;
    for (i = 0; i < num_words; ++i) {
        uECC_word_t sum = left[i] + right[i] + carry;
        if (sum != left[i]) {
            carry = (sum < left[i]);
        }
        result[i] = sum;
    }
    return carry;
}